

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O2

void __thiscall
adios2::core::engine::ssc::SscWriterGeneric::EndStep(SscWriterGeneric *this,bool writerLocked)

{
  SscWriterGeneric *local_30;
  thread local_28;
  code *local_20;
  undefined8 local_18;
  
  this->m_WriterDefinitionsLocked = writerLocked;
  if ((this->super_SscWriterBase).m_CurrentStep == 0) {
    if ((this->super_SscWriterBase).m_Threading != true) {
      EndStepFirst(this);
      return;
    }
    local_20 = EndStepFirst;
  }
  else {
    if ((writerLocked) && (this->m_ReaderSelectionsLocked == true)) {
      EndStepConsequentFixed(this);
      return;
    }
    if ((this->super_SscWriterBase).m_Threading != true) {
      EndStepConsequentFlexible(this);
      return;
    }
    local_20 = EndStepConsequentFlexible;
  }
  local_18 = 0;
  local_30 = this;
  std::thread::
  thread<void(adios2::core::engine::ssc::SscWriterGeneric::*)(),adios2::core::engine::ssc::SscWriterGeneric*,void>
            (&local_28,(type *)&local_20,&local_30);
  std::thread::operator=(&this->m_EndStepThread,&local_28);
  std::thread::~thread(&local_28);
  return;
}

Assistant:

void SscWriterGeneric::EndStep(const bool writerLocked)
{

    m_WriterDefinitionsLocked = writerLocked;

    if (m_CurrentStep == 0)
    {
        if (m_Threading)
        {
            m_EndStepThread = std::thread(&SscWriterGeneric::EndStepFirst, this);
        }
        else
        {
            EndStepFirst();
        }
    }
    else
    {
        if (m_WriterDefinitionsLocked && m_ReaderSelectionsLocked)
        {
            EndStepConsequentFixed();
        }
        else
        {
            if (m_Threading)
            {
                m_EndStepThread = std::thread(&SscWriterGeneric::EndStepConsequentFlexible, this);
            }
            else
            {
                EndStepConsequentFlexible();
            }
        }
    }
}